

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cba.h
# Opt level: O0

void Cba_NtkPrepareSeq(Cba_Ntk_t *p)

{
  int iVar1;
  int local_14;
  int iObj;
  Cba_Ntk_t *p_local;
  
  iVar1 = Cba_NtkBoxSeqNum(p);
  if (iVar1 != 0) {
    __assert_fail("Cba_NtkBoxSeqNum(p) == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/cba/cba.h"
                  ,0x295,"void Cba_NtkPrepareSeq(Cba_Ntk_t *)");
  }
  iVar1 = Cba_NtkIsSeq(p);
  if (iVar1 != 0) {
    for (local_14 = 1; iVar1 = Vec_StrSize(&p->vObjType), local_14 < iVar1; local_14 = local_14 + 1)
    {
      iVar1 = Cba_ObjIsBox(p,local_14);
      if ((iVar1 != 0) && (iVar1 = Cba_ObjIsSeq(p,local_14), iVar1 != 0)) {
        Vec_IntPush(&p->vSeq,local_14);
      }
    }
  }
  return;
}

Assistant:

static inline void Cba_NtkPrepareSeq( Cba_Ntk_t * p )
{
    int iObj;
    assert( Cba_NtkBoxSeqNum(p) == 0 );
    if ( !Cba_NtkIsSeq(p) )
        return;
    Cba_NtkForEachBox( p, iObj )
        if ( Cba_ObjIsSeq(p, iObj) )
            Vec_IntPush( &p->vSeq, iObj );
    // Cba_NtkObjOrder( p, &p->vSeq, NULL );
}